

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::ParsePathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  bool bVar2;
  reference pvVar3;
  Vector *pVVar4;
  idx_t split_size;
  string_t *input;
  ulong uVar5;
  idx_t i;
  ulong row_idx;
  idx_t list_idx;
  char *input_data_00;
  idx_t local_148;
  SplitInput split_input;
  undefined8 local_f0;
  char *local_e8;
  string input_sep;
  string sep;
  UnifiedVectorFormat input_data;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&input_data);
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(pvVar3,args->count,&input_data);
  ::std::__cxx11::string::string((string *)&input_sep,"default",(allocator *)&sep);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd0) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&sep);
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
    Vector::ToUnifiedFormat(pvVar3,args->count,(UnifiedVectorFormat *)&sep);
    if ((sep.field_2._M_allocated_capacity == 0) ||
       ((*(byte *)sep.field_2._M_allocated_capacity & 1) != 0)) {
      string_t::GetString_abi_cxx11_((string *)&split_input,(string_t *)sep._M_string_length);
      ::std::__cxx11::string::operator=((string *)&input_sep,(string *)&split_input);
      ::std::__cxx11::string::~string((string *)&split_input);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&sep);
  }
  string_t::string_t((string_t *)&split_input,&input_sep);
  GetSeparator_abi_cxx11_(&sep,(duckdb *)&split_input,input);
  Vector::SetVectorType(result,FLAT_VECTOR);
  ListVector::SetListSize(result,0);
  pdVar1 = result->data;
  pVVar4 = ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(result);
  row_idx = 0;
  local_148 = 0;
  do {
    if (args->count <= row_idx) {
      ListVector::SetListSize(result,local_148);
      bVar2 = DataChunk::AllConstant(args);
      if (bVar2) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      ::std::__cxx11::string::~string((string *)&sep);
      ::std::__cxx11::string::~string((string *)&input_sep);
      UnifiedVectorFormat::~UnifiedVectorFormat(&input_data);
      return;
    }
    uVar5 = row_idx;
    if ((input_data.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)(input_data.sel)->sel_vector[row_idx];
    }
    if ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
         (uVar5 & 0x3f) & 1) != 0)) {
      split_input.offset = local_148;
      local_f0 = *(ulong *)(input_data.data + uVar5 * 0x10);
      local_e8 = *(char **)(input_data.data + uVar5 * 0x10 + 8);
      split_input.result_list = result;
      split_input.result_child = pVVar4;
      if ((uint)local_f0 == 0) {
        list_idx = 0;
      }
      else {
        uVar5 = local_f0 & 0xffffffff;
        input_data_00 = local_e8;
        if ((uint)local_f0 < 0xd) {
          input_data_00 = (char *)((long)&local_f0 + 4);
        }
        list_idx = 0;
        for (; uVar5 != 0; uVar5 = uVar5 - (split_size + 1)) {
          split_size = Find(input_data_00,uVar5,&sep);
          if ((split_size == 0xffffffffffffffff) || (uVar5 < split_size)) {
            SplitInput::AddSplit(&split_input,input_data_00,uVar5,list_idx);
            list_idx = list_idx + 1;
            break;
          }
          if (split_size == 0) {
            if (list_idx == 0) {
              SplitInput::AddSplit(&split_input,input_data_00,1,0);
              list_idx = 1;
              if (uVar5 == 1) break;
            }
          }
          else {
            SplitInput::AddSplit(&split_input,input_data_00,split_size,list_idx);
            list_idx = list_idx + 1;
          }
          input_data_00 = input_data_00 + split_size + 1;
        }
      }
      *(idx_t *)(pdVar1 + row_idx * 0x10 + 8) = list_idx;
      *(idx_t *)(pdVar1 + row_idx * 0x10) = local_148;
      local_148 = local_148 + list_idx;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

static void ParsePathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1 || args.ColumnCount() == 2);
	UnifiedVectorFormat input_data;
	args.data[0].ToUnifiedFormat(args.size(), input_data);
	auto inputs = UnifiedVectorFormat::GetData<string_t>(input_data);

	// set the separator
	string input_sep = "default";
	if (args.ColumnCount() == 2) {
		UnifiedVectorFormat sep_data;
		args.data[1].ToUnifiedFormat(args.size(), sep_data);
		if (sep_data.validity.RowIsValid(0)) {
			input_sep = UnifiedVectorFormat::GetData<string_t>(sep_data)->GetString();
		}
	}
	const string sep = GetSeparator(input_sep);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	ListVector::SetListSize(result, 0);

	// set up the list entries
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &child_entry = ListVector::GetEntry(result);
	auto &result_mask = FlatVector::Validity(result);
	idx_t total_splits = 0;
	for (idx_t i = 0; i < args.size(); i++) {
		auto input_idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(input_idx)) {
			result_mask.SetInvalid(i);
			continue;
		}
		SplitInput split_input(result, child_entry, total_splits);
		auto list_length = SplitPath(inputs[input_idx], sep, split_input);
		list_data[i].length = list_length;
		list_data[i].offset = total_splits;
		total_splits += list_length;
	}
	ListVector::SetListSize(result, total_splits);
	D_ASSERT(ListVector::GetListSize(result) == total_splits);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}